

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O1

int IDARcheck3(IDAMem IDA_mem)

{
  sunrealtype *psVar1;
  sunrealtype *psVar2;
  int *piVar3;
  int *piVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  sunrealtype sVar24;
  
  if (IDA_mem->ida_taskc == 1) {
    uVar11 = -(ulong)((IDA_mem->ida_toutc - IDA_mem->ida_tn) * IDA_mem->ida_hh < 0.0);
    sVar24 = (sunrealtype)(~uVar11 & (ulong)IDA_mem->ida_tn | (ulong)IDA_mem->ida_toutc & uVar11);
  }
  else {
    if (IDA_mem->ida_taskc != 2) goto LAB_0010d55c;
    sVar24 = IDA_mem->ida_tn;
  }
  IDA_mem->ida_thi = sVar24;
LAB_0010d55c:
  IDAGetSolution(IDA_mem,IDA_mem->ida_thi,IDA_mem->ida_yy,IDA_mem->ida_yp);
  iVar9 = (*IDA_mem->ida_gfun)
                    (IDA_mem->ida_thi,IDA_mem->ida_yy,IDA_mem->ida_yp,IDA_mem->ida_ghi,
                     IDA_mem->ida_user_data);
  IDA_mem->ida_nge = IDA_mem->ida_nge + 1;
  iVar15 = -10;
  if (iVar9 == 0) {
    dVar19 = (ABS(IDA_mem->ida_hh) + ABS(IDA_mem->ida_tn)) * IDA_mem->ida_uround * 100.0;
    IDA_mem->ida_ttol = dVar19;
    iVar9 = IDA_mem->ida_nrtfn;
    uVar11 = (ulong)iVar9;
    if ((long)uVar11 < 1) {
      uVar17 = 0;
      bVar7 = true;
      bVar8 = true;
    }
    else {
      uVar13 = 0;
      bVar8 = false;
      bVar7 = false;
      uVar17 = 0;
      dVar20 = 0.0;
      do {
        if (IDA_mem->ida_gactive[uVar13] != 0) {
          dVar21 = IDA_mem->ida_ghi[uVar13];
          if ((dVar21 != 0.0) || (NAN(dVar21))) {
            dVar5 = IDA_mem->ida_glo[uVar13];
            if ((((0.0 < dVar21) && (dVar5 < 0.0)) || ((dVar21 < 0.0 && (0.0 < dVar5)))) &&
               (((double)IDA_mem->ida_rootdir[uVar13] * dVar5 <= 0.0 &&
                (dVar21 = ABS(dVar21 / (dVar21 - dVar5)), dVar20 < dVar21)))) {
              bVar8 = true;
              uVar17 = uVar13 & 0xffffffff;
              dVar20 = dVar21;
            }
          }
          else if ((double)IDA_mem->ida_rootdir[uVar13] * IDA_mem->ida_glo[uVar13] <= 0.0) {
            bVar7 = true;
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
      bVar8 = !bVar8;
      bVar7 = !bVar7;
    }
    if (bVar8) {
      IDA_mem->ida_trout = IDA_mem->ida_thi;
      if (0 < iVar9) {
        psVar1 = IDA_mem->ida_ghi;
        psVar2 = IDA_mem->ida_grout;
        uVar17 = 0;
        do {
          psVar2[uVar17] = psVar1[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar11 != uVar17);
      }
      if ((bool)(iVar9 < 1 | bVar7)) {
        uVar10 = (uint)(bVar7 ^ 1);
      }
      else {
        piVar4 = IDA_mem->ida_iroots;
        piVar3 = IDA_mem->ida_gactive;
        lVar14 = 0;
        do {
          piVar4[lVar14] = 0;
          if ((((piVar3[lVar14] != 0) && (IDA_mem->ida_ghi[lVar14] == 0.0)) &&
              (!NAN(IDA_mem->ida_ghi[lVar14]))) &&
             ((double)IDA_mem->ida_rootdir[lVar14] * IDA_mem->ida_glo[lVar14] <= 0.0)) {
            piVar4[lVar14] = (uint)(IDA_mem->ida_glo[lVar14] <= 0.0) * 2 + -1;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < IDA_mem->ida_nrtfn);
        uVar10 = 1;
      }
    }
    else {
      dVar20 = IDA_mem->ida_tlo;
      dVar21 = IDA_mem->ida_thi;
      dVar5 = dVar21 - dVar20;
      dVar6 = ABS(dVar5);
      if (dVar19 < dVar6) {
        dVar23 = 1.0;
        dVar22 = 0.5;
        iVar9 = -1;
        iVar18 = 0;
        do {
          if (iVar9 == iVar18) {
            dVar23 = dVar23 * dVar22;
          }
          else {
            dVar23 = 1.0;
          }
          sVar24 = dVar21 - (dVar5 * IDA_mem->ida_ghi[(int)uVar17]) /
                            (IDA_mem->ida_ghi[(int)uVar17] - IDA_mem->ida_glo[(int)uVar17] * dVar23)
          ;
          if (ABS(sVar24 - dVar20) < dVar19 * 0.5) {
            uVar11 = -(ulong)(5.0 < dVar6 / dVar19);
            sVar24 = (double)(uVar11 & 0x3fb999999999999a |
                             ~uVar11 & (ulong)(0.5 / (dVar6 / dVar19))) * dVar5 + dVar20;
          }
          if (ABS(dVar21 - sVar24) < dVar19 * 0.5) {
            uVar11 = -(ulong)(5.0 < dVar6 / dVar19);
            sVar24 = (double)(uVar11 & 0xbfb999999999999a |
                             ~uVar11 & (ulong)(-0.5 / (dVar6 / dVar19))) * dVar5 + dVar21;
          }
          IDAGetSolution(IDA_mem,sVar24,IDA_mem->ida_yy,IDA_mem->ida_yp);
          iVar9 = (*IDA_mem->ida_gfun)
                            (sVar24,IDA_mem->ida_yy,IDA_mem->ida_yp,IDA_mem->ida_grout,
                             IDA_mem->ida_user_data);
          IDA_mem->ida_nge = IDA_mem->ida_nge + 1;
          if (iVar9 != 0) {
            uVar10 = 0xfffffff6;
            goto LAB_0010dd03;
          }
          iVar9 = IDA_mem->ida_nrtfn;
          uVar11 = (ulong)iVar9;
          if ((long)uVar11 < 1) {
            bVar8 = true;
            bVar7 = true;
          }
          else {
            dVar19 = 0.0;
            uVar13 = 0;
            bVar7 = false;
            bVar8 = false;
            do {
              if (IDA_mem->ida_gactive[uVar13] != 0) {
                dVar20 = IDA_mem->ida_grout[uVar13];
                if ((dVar20 != 0.0) || (NAN(dVar20))) {
                  dVar21 = IDA_mem->ida_glo[uVar13];
                  if ((((0.0 < dVar20) && (dVar21 < 0.0)) || ((dVar20 < 0.0 && (0.0 < dVar21)))) &&
                     (((double)IDA_mem->ida_rootdir[uVar13] * dVar21 <= 0.0 &&
                      (dVar20 = ABS(dVar20 / (dVar20 - dVar21)), dVar19 < dVar20)))) {
                    bVar7 = true;
                    uVar17 = uVar13 & 0xffffffff;
                    dVar19 = dVar20;
                  }
                }
                else if ((double)IDA_mem->ida_rootdir[uVar13] * IDA_mem->ida_glo[uVar13] <= 0.0) {
                  bVar8 = true;
                }
              }
              uVar13 = uVar13 + 1;
            } while (uVar11 != uVar13);
            bVar7 = !bVar7;
            bVar8 = !bVar8;
          }
          if (bVar7) {
            if (!bVar8) {
              IDA_mem->ida_thi = sVar24;
              if (0 < iVar9) {
                psVar1 = IDA_mem->ida_ghi;
                psVar2 = IDA_mem->ida_grout;
                uVar17 = 0;
                do {
                  psVar1[uVar17] = psVar2[uVar17];
                  uVar17 = uVar17 + 1;
                } while (uVar11 != uVar17);
              }
              break;
            }
            IDA_mem->ida_tlo = sVar24;
            if (0 < iVar9) {
              psVar1 = IDA_mem->ida_glo;
              psVar2 = IDA_mem->ida_grout;
              uVar13 = 0;
              do {
                psVar1[uVar13] = psVar2[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar11 != uVar13);
            }
            iVar12 = 2;
            dVar22 = 2.0;
            if (ABS(IDA_mem->ida_thi - IDA_mem->ida_tlo) <= IDA_mem->ida_ttol) break;
          }
          else {
            IDA_mem->ida_thi = sVar24;
            if (0 < iVar9) {
              psVar1 = IDA_mem->ida_ghi;
              psVar2 = IDA_mem->ida_grout;
              uVar13 = 0;
              do {
                psVar1[uVar13] = psVar2[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar11 != uVar13);
            }
            iVar12 = 1;
            dVar22 = 0.5;
            if (ABS(IDA_mem->ida_thi - IDA_mem->ida_tlo) <= IDA_mem->ida_ttol) break;
          }
          dVar20 = IDA_mem->ida_tlo;
          dVar21 = IDA_mem->ida_thi;
          dVar5 = dVar21 - dVar20;
          dVar6 = ABS(dVar5);
          dVar19 = IDA_mem->ida_ttol;
          iVar9 = iVar18;
          iVar18 = iVar12;
        } while (dVar19 < dVar6);
      }
      IDA_mem->ida_trout = IDA_mem->ida_thi;
      uVar10 = 1;
      if (0 < IDA_mem->ida_nrtfn) {
        piVar4 = IDA_mem->ida_iroots;
        psVar1 = IDA_mem->ida_ghi;
        psVar2 = IDA_mem->ida_grout;
        piVar3 = IDA_mem->ida_gactive;
        lVar14 = 0;
        do {
          psVar2[lVar14] = psVar1[lVar14];
          piVar4[lVar14] = 0;
          if (piVar3[lVar14] != 0) {
            dVar19 = psVar1[lVar14];
            if ((dVar19 == 0.0) &&
               ((double)IDA_mem->ida_rootdir[lVar14] * IDA_mem->ida_glo[lVar14] <= 0.0)) {
              piVar4[lVar14] = (uint)(IDA_mem->ida_glo[lVar14] <= 0.0) * 2 + -1;
            }
            dVar20 = IDA_mem->ida_glo[lVar14];
            if ((((0.0 < dVar19) && (dVar20 < 0.0)) || ((dVar19 < 0.0 && (0.0 < dVar20)))) &&
               ((double)IDA_mem->ida_rootdir[lVar14] * dVar20 <= 0.0)) {
              piVar4[lVar14] = (uint)(dVar20 <= 0.0) * 2 + -1;
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < IDA_mem->ida_nrtfn);
      }
    }
LAB_0010dd03:
    if (uVar10 != 0xfffffff6) {
      uVar16 = IDA_mem->ida_nrtfn;
      if (0 < (int)uVar16) {
        piVar4 = IDA_mem->ida_gactive;
        lVar14 = 0;
        do {
          if ((piVar4[lVar14] == 0) &&
             ((IDA_mem->ida_grout[lVar14] != 0.0 || (NAN(IDA_mem->ida_grout[lVar14]))))) {
            piVar4[lVar14] = 1;
          }
          lVar14 = lVar14 + 1;
          uVar16 = IDA_mem->ida_nrtfn;
        } while (lVar14 < (int)uVar16);
      }
      IDA_mem->ida_tlo = IDA_mem->ida_trout;
      if (0 < (int)uVar16) {
        psVar1 = IDA_mem->ida_glo;
        psVar2 = IDA_mem->ida_grout;
        uVar11 = 0;
        do {
          psVar1[uVar11] = psVar2[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar16 != uVar11);
      }
      if (uVar10 == 0) {
        iVar15 = 0;
      }
      else {
        IDAGetSolution(IDA_mem,IDA_mem->ida_trout,IDA_mem->ida_yy,IDA_mem->ida_yp);
        iVar15 = 1;
      }
    }
  }
  return iVar15;
}

Assistant:

static int IDARcheck3(IDAMem IDA_mem)
{
  int i, ier, retval;

  /* Set thi = tn or tout, whichever comes first. */
  if (IDA_mem->ida_taskc == IDA_ONE_STEP)
  {
    IDA_mem->ida_thi = IDA_mem->ida_tn;
  }
  if (IDA_mem->ida_taskc == IDA_NORMAL)
  {
    IDA_mem->ida_thi =
      ((IDA_mem->ida_toutc - IDA_mem->ida_tn) * IDA_mem->ida_hh >= ZERO)
        ? IDA_mem->ida_tn
        : IDA_mem->ida_toutc;
  }

  /* Get y and y' at thi. */
  (void)IDAGetSolution(IDA_mem, IDA_mem->ida_thi, IDA_mem->ida_yy,
                       IDA_mem->ida_yp);

  /* Set ghi = g(thi) and call IDARootfind to search (tlo,thi) for roots. */
  retval = IDA_mem->ida_gfun(IDA_mem->ida_thi, IDA_mem->ida_yy, IDA_mem->ida_yp,
                             IDA_mem->ida_ghi, IDA_mem->ida_user_data);
  IDA_mem->ida_nge++;
  if (retval != 0) { return (IDA_RTFUNC_FAIL); }

  IDA_mem->ida_ttol = ((SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh)) *
                       IDA_mem->ida_uround * HUNDRED);
  ier               = IDARootfind(IDA_mem);
  if (ier == IDA_RTFUNC_FAIL) { return (IDA_RTFUNC_FAIL); }
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (!IDA_mem->ida_gactive[i] && IDA_mem->ida_grout[i] != ZERO)
    {
      IDA_mem->ida_gactive[i] = SUNTRUE;
    }
  }
  IDA_mem->ida_tlo = IDA_mem->ida_trout;
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    IDA_mem->ida_glo[i] = IDA_mem->ida_grout[i];
  }

  /* If no root found, return IDA_SUCCESS. */
  if (ier == IDA_SUCCESS) { return (IDA_SUCCESS); }

  /* If a root was found, interpolate to get y(trout) and return.  */
  (void)IDAGetSolution(IDA_mem, IDA_mem->ida_trout, IDA_mem->ida_yy,
                       IDA_mem->ida_yp);
  return (RTFOUND);
}